

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

string * __thiscall
duckdb_mbedtls::MbedTlsWrapper::SHA256State::Finalize_abi_cxx11_
          (string *__return_storage_ptr__,SHA256State *this)

{
  mbedtls_sha256_context *ctx;
  int iVar1;
  runtime_error *this_00;
  
  ctx = (mbedtls_sha256_context *)this->sha_context;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  iVar1 = mbedtls_sha256_finish(ctx,(uchar *)(__return_storage_ptr__->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"SHA256 Error");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string MbedTlsWrapper::SHA256State::Finalize() {
	auto context = reinterpret_cast<mbedtls_sha256_context *>(sha_context);

	string hash;
	hash.resize(MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);

	if (mbedtls_sha256_finish(context, (unsigned char *)hash.data())) {
		throw std::runtime_error("SHA256 Error");
	}

	return hash;
}